

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O2

void so_5::impl::msg_tracing_helpers::details::make_trace_to_1(ostream *s,message_ref_t *message)

{
  pointer pVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  anon_class_8_1_bc4532e7 detect_pointers;
  pointer local_38;
  void *local_30;
  message_ref_t *local_28;
  
  local_28 = message;
  make_trace_to_1::anon_class_8_1_bc4532e7::operator()((anon_class_8_1_bc4532e7 *)&local_38);
  pVar1.m_what = local_38.m_what;
  if (local_30 != (void *)0x0) {
    poVar3 = std::operator<<(s,"[envelope_ptr=");
    local_38.m_what = local_30;
    poVar3 = so_5::details::ios_helpers::operator<<(poVar3,&local_38);
    std::operator<<(poVar3,"]");
  }
  if (pVar1.m_what == (void *)0x0) {
    pcVar4 = "[signal]";
    poVar3 = s;
  }
  else {
    poVar3 = std::operator<<(s,"[payload_ptr=");
    local_38.m_what = pVar1.m_what;
    poVar3 = so_5::details::ios_helpers::operator<<(poVar3,&local_38);
    pcVar4 = "]";
  }
  std::operator<<(poVar3,pcVar4);
  if (message->m_obj != (message_t *)0x0) {
    iVar2 = (*message->m_obj->_vptr_message_t[3])();
    if (iVar2 == 1) {
      std::operator<<(s,"[mutable]");
    }
  }
  return;
}

Assistant:

inline void
make_trace_to_1( std::ostream & s, const message_ref_t & message )
	{
		// The first pointer is a pointer to envelope.
		// The second pointer is a pointer to payload.
		using msg_pointers = std::tuple< const void *, const void * >;

		auto detect_pointers = [&message]() -> msg_pointers {
			if( const message_t * envelope = message.get() )
				{
					// We can try cases with service requests and user-type messages.
					const void * payload =
							internal_message_iface_t{ *envelope }.payload_ptr();

					if( payload != envelope )
						// There are an envelope and payload inside it.
						return msg_pointers{ envelope, payload };
					else
						// There is only payload.
						return msg_pointers{ nullptr, envelope };
				}
			else
				// It is a signal there is nothing.
				return msg_pointers{ nullptr, nullptr };
		};

		const void * envelope = nullptr;
		const void * payload = nullptr;

		std::tie(envelope,payload) = detect_pointers();

		if( envelope )
			s << "[envelope_ptr=" << pointer{envelope} << "]";
		if( payload )
			s << "[payload_ptr=" << pointer{payload} << "]";
		else
			s << "[signal]";
		if( message_mutability_t::mutable_message == message_mutability(message) )
			s << "[mutable]";
	}